

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::EnumDescriptorProto_EnumReservedRange::_InternalParse
          (EnumDescriptorProto_EnumReservedRange *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint32_t uVar2;
  ulong tag_00;
  UnknownFieldSet *unknown;
  uint local_28;
  HasBits<1UL> local_24;
  uint32_t tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  EnumDescriptorProto_EnumReservedRange *this_local;
  
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  internal::HasBits<1UL>::HasBits(&local_24);
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done(_tag,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_006a187d;
      ctx_local = (ParseContext *)internal::ReadTag((char *)ctx_local,&local_28,0);
      if (local_28 >> 3 != 1) break;
      if ((local_28 & 0xff) == 8) {
        _Internal::set_has_start(&local_24);
        uVar2 = internal::ReadVarint32((char **)&ctx_local);
        this->start_ = uVar2;
      }
      else {
LAB_006a1807:
        if ((local_28 == 0) || ((local_28 & 7) == 4)) {
          if (ctx_local != (ParseContext *)0x0) {
            internal::EpsCopyInputStream::SetLastTag(&_tag->super_EpsCopyInputStream,local_28);
            goto LAB_006a187d;
          }
          goto LAB_006a1898;
        }
        tag_00 = (ulong)local_28;
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                            (&(this->super_Message).super_MessageLite._internal_metadata_);
        ctx_local = (ParseContext *)
                    internal::UnknownFieldParse(tag_00,unknown,(char *)ctx_local,_tag);
      }
      if (ctx_local == (ParseContext *)0x0) goto LAB_006a1898;
    }
    if ((local_28 >> 3 != 2) || ((local_28 & 0xff) != 0x10)) goto LAB_006a1807;
    _Internal::set_has_end(&local_24);
    uVar2 = internal::ReadVarint32((char **)&ctx_local);
    this->end_ = uVar2;
  } while (ctx_local != (ParseContext *)0x0);
LAB_006a1898:
  ctx_local = (ParseContext *)0x0;
LAB_006a187d:
  internal::HasBits<1UL>::Or(&this->_has_bits_,&local_24);
  return (char *)ctx_local;
}

Assistant:

const char* EnumDescriptorProto_EnumReservedRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}